

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuSeedBuilder.cpp
# Opt level: O2

SeedBuilder * tcu::operator<<(SeedBuilder *builder,deUint32 value)

{
  deUint8 data [4];
  
  data = (deUint8  [4])(value ^ 0x75db424e);
  SeedBuilder::feed(builder,4,data);
  return builder;
}

Assistant:

SeedBuilder& operator<< (SeedBuilder& builder, deUint32 value)
{
	const deUint32	val		= value ^ 1977303630u;
	const deUint8	data[]	=
	{
		(deUint8)(val & 0xFFu),
		(deUint8)((val >> 8) & 0xFFu),
		(deUint8)((val >> 16) & 0xFFu),
		(deUint8)((val >> 24) & 0xFFu),
	};

	builder.feed(sizeof(data), data);
	return builder;
}